

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::
parse_format_string<false,char,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&>
          (detail *this,basic_string_view<char> format_str,
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          *handler)

{
  bool bVar1;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *this_00;
  char *end;
  detail *last;
  error_handler *this_01;
  detail *this_02;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *this_03;
  char *p;
  id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&,_char>
  local_40;
  writer write;
  
  this_00 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             *)format_str.size_;
  last = (detail *)(format_str.data_ + (long)this);
  write.handler_ = this_00;
  do {
    if (this == last) {
      return;
    }
    p = (char *)this;
    if ((*this != (detail)0x7b) &&
       (bVar1 = find<false,char,char_const*>((char *)(this + 1),(char *)last,'{',&p), !bVar1)) {
      parse_format_string<false,_char,_fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&>
      ::writer::operator()(&write,(char *)this,(char *)last);
      return;
    }
    this_01 = (error_handler *)&write;
    parse_format_string<false,_char,_fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&>
    ::writer::operator()(&write,(char *)this,p);
    this_02 = (detail *)(p + 1);
    if (this_02 == last) {
      p = (char *)this_02;
      error_handler::on_error(this_01,"invalid format string");
    }
    if (*this_02 == (detail)0x7b) {
      end = p + 2;
      p = (char *)this_02;
      format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
      ::on_text(this_00,(char *)this_02,end);
    }
    else {
      if (*this_02 == (detail)0x7d) {
        p = (char *)this_02;
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
        ::on_arg_id(this_00);
      }
      else {
        p = (char *)this_02;
        local_40.handler = this_00;
        p = parse_arg_id<char,fmt::v6::detail::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&,char>>
                      ((char *)this_02,(char *)last,&local_40);
        if ((detail *)p == last) {
LAB_001078ec:
          error_handler::on_error((error_handler *)this_02,"missing \'}\' in format string");
        }
        if ((detail)*p == (detail)0x3a) {
          this_03 = this_00;
          p = format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
              ::on_format_specs(this_00,(char *)((detail *)p + 1),(char *)last);
          if (((detail *)p == last) || ((detail)*p != (detail)0x7d)) {
            error_handler::on_error((error_handler *)this_03,"unknown format specifier");
          }
          goto LAB_001078b5;
        }
        if ((detail)*p != (detail)0x7d) goto LAB_001078ec;
      }
      format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
      ::on_replacement_field(this_00,p);
    }
LAB_001078b5:
    this = (detail *)(p + 1);
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin + 1, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}